

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vector.hpp
# Opt level: O3

void __thiscall
tlx::
SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
::resize(SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
         *this,size_type new_size)

{
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *__result;
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *__first;
  size_type *psVar1;
  ulong uVar2;
  ulong uVar3;
  value_type *tmp;
  
  __first = this->array_;
  uVar2 = new_size * 8;
  uVar3 = 0xffffffffffffffff;
  if (uVar2 < 0xfffffffffffffff8) {
    uVar3 = uVar2 + 8;
  }
  psVar1 = (size_type *)operator_new__(-(ulong)(new_size >> 0x3d != 0) | uVar3);
  __result = (CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)(psVar1 + 1);
  *psVar1 = new_size;
  if (__first == (CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)0x0) {
    if (new_size != 0) {
      memset(__result,0,uVar2);
    }
    this->array_ = __result;
  }
  else {
    if (new_size != 0) {
      memset(__result,0,uVar2);
    }
    this->array_ = __result;
    uVar2 = this->size_;
    if (new_size <= this->size_) {
      uVar2 = new_size;
    }
    std::__copy_move<true,false,std::random_access_iterator_tag>::
    __copy_m<tlx::CountingPtr<foxxll::file,tlx::CountingPtrDefaultDeleter>*,tlx::CountingPtr<foxxll::file,tlx::CountingPtrDefaultDeleter>*>
              (__first,__first + uVar2,__result);
    destroy_array(__first,this->size_);
  }
  this->size_ = new_size;
  return;
}

Assistant:

void resize(size_type new_size) {
        if (array_) {
            value_type* tmp = array_;
            array_ = create_array(new_size);
            std::move(tmp, tmp + std::min(size_, new_size), array_);
            destroy_array(tmp, size_);
            size_ = new_size;
        }
        else {
            array_ = create_array(new_size);
            size_ = new_size;
        }
    }